

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

size_t __thiscall
booster::locale::impl_icu::number_format<wchar_t>::do_parse<int>
          (number_format<wchar_t> *this,string_type *str,int *v)

{
  bool bVar1;
  int32_t iVar2;
  size_t sVar3;
  char_type_conflict *pcVar4;
  char_type_conflict *pcVar5;
  size_t n;
  long lVar6;
  undefined4 *in_RDX;
  long in_RDI;
  size_t cut;
  int tmp_v;
  UnicodeString tmp;
  ParsePosition pp;
  Formattable val;
  Formattable *in_stack_fffffffffffffea8;
  ParsePosition *in_stack_fffffffffffffeb0;
  number_format<wchar_t> *in_stack_fffffffffffffeb8;
  char_type_conflict *in_stack_fffffffffffffec8;
  UnicodeString *str_00;
  icu_std_converter<wchar_t,_4> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined4 local_f4;
  UnicodeString local_f0 [80];
  ParsePosition local_a0 [16];
  Formattable local_90 [112];
  undefined4 *local_20;
  size_t local_8;
  
  local_20 = in_RDX;
  icu_70::Formattable::Formattable(local_90);
  icu_70::ParsePosition::ParsePosition(in_stack_fffffffffffffeb0);
  sVar3 = in_RDI + 8;
  std::__cxx11::wstring::data();
  std::__cxx11::wstring::data();
  std::__cxx11::wstring::size();
  icu_std_converter<wchar_t,_4>::icu
            ((icu_std_converter<wchar_t,_4> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (char_type_conflict *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  (**(code **)(**(long **)(in_RDI + 0x10) + 0xa0))
            (*(long **)(in_RDI + 0x10),local_f0,local_90,local_a0);
  iVar2 = icu_70::ParsePosition::getIndex(local_a0);
  if ((iVar2 == 0) ||
     (bVar1 = get_value(in_stack_fffffffffffffeb8,(int32_t *)in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffea8), !bVar1)) {
    local_8 = 0;
  }
  else {
    pcVar4 = (char_type_conflict *)(in_RDI + 8);
    pcVar5 = (char_type_conflict *)std::__cxx11::wstring::data();
    n = std::__cxx11::wstring::data();
    lVar6 = std::__cxx11::wstring::size();
    str_00 = (UnicodeString *)(n + lVar6 * 4);
    icu_70::ParsePosition::getIndex(local_a0);
    local_8 = icu_std_converter<wchar_t,_4>::cut
                        (in_stack_fffffffffffffed0,str_00,pcVar5,pcVar4,n,0,sVar3);
    if (local_8 == 0) {
      local_8 = 0;
    }
    else {
      *local_20 = local_f4;
    }
  }
  icu_70::UnicodeString::~UnicodeString(local_f0);
  icu_70::ParsePosition::~ParsePosition(local_a0);
  icu_70::Formattable::~Formattable(local_90);
  return local_8;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &v) const
            {
                icu::Formattable val;
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data()+str.size());

                icu_fmt_->parse(tmp,val,pp);

                ValueType tmp_v;

                if(pp.getIndex() == 0 || !get_value(tmp_v,val))
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                v=tmp_v;
                return cut;
            }